

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_restrict_key_policy(psa_key_policy_t *policy,psa_key_policy_t *constraint)

{
  psa_algorithm_t pVar1;
  psa_algorithm_t pVar2;
  psa_algorithm_t intersection_alg2;
  psa_algorithm_t intersection_alg;
  psa_key_policy_t *constraint_local;
  psa_key_policy_t *policy_local;
  
  pVar1 = psa_key_policy_algorithm_intersection(policy->alg,constraint->alg);
  pVar2 = psa_key_policy_algorithm_intersection(policy->alg2,constraint->alg2);
  if (((pVar1 == 0) && (policy->alg != 0)) && (constraint->alg != 0)) {
    policy_local._4_4_ = -0x87;
  }
  else if (((pVar2 == 0) && (policy->alg2 != 0)) && (constraint->alg2 != 0)) {
    policy_local._4_4_ = -0x87;
  }
  else {
    policy->usage = constraint->usage & policy->usage;
    policy->alg = pVar1;
    policy->alg2 = pVar2;
    policy_local._4_4_ = 0;
  }
  return policy_local._4_4_;
}

Assistant:

static psa_status_t psa_restrict_key_policy(
    psa_key_policy_t *policy,
    const psa_key_policy_t *constraint )
{
    psa_algorithm_t intersection_alg =
        psa_key_policy_algorithm_intersection( policy->alg, constraint->alg );
    psa_algorithm_t intersection_alg2 =
        psa_key_policy_algorithm_intersection( policy->alg2, constraint->alg2 );
    if( intersection_alg == 0 && policy->alg != 0 && constraint->alg != 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );
    if( intersection_alg2 == 0 && policy->alg2 != 0 && constraint->alg2 != 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );
    policy->usage &= constraint->usage;
    policy->alg = intersection_alg;
    policy->alg2 = intersection_alg2;
    return( PSA_SUCCESS );
}